

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void __thiscall ImGuiInputTextState::OnKeyPressed(ImGuiInputTextState *this,int key)

{
  STB_TexteditState *state;
  float fVar1;
  uchar uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  int iVar5;
  undefined2 uVar6;
  undefined2 uVar7;
  unsigned_short *puVar8;
  float fVar9;
  StbUndoRecord *pSVar10;
  bool bVar11;
  int iVar12;
  uint uVar13;
  StbFindState *pSVar14;
  ImWchar *pIVar15;
  ulong uVar16;
  short sVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  int *piVar21;
  ulong uVar22;
  int iVar23;
  long lVar24;
  int iVar25;
  int iVar26;
  float fVar27;
  StbFindState find;
  StbTexteditRow row;
  
  state = &this->StbState;
  uVar2 = (this->StbState).single_line;
LAB_0013ff19:
  switch(key) {
  case 0x10000:
    goto switchD_0013ff2c_caseD_10000;
  case 0x10001:
    if ((this->StbState).select_start == (this->StbState).select_end) {
      state->cursor = state->cursor + 1;
    }
    else {
      ImGuiStb::stb_textedit_move_to_last(this,state);
    }
    ImGuiStb::stb_textedit_clamp(this,state);
    goto LAB_00140821;
  case 0x10002:
switchD_0013ff2c_caseD_10002:
    if (uVar2 == '\0') {
      if ((key & 0x20000U) == 0) {
        if ((this->StbState).select_start != (this->StbState).select_end) {
          ImGuiStb::stb_textedit_move_to_first(state);
        }
      }
      else {
        ImGuiStb::stb_textedit_prep_selection_at_cursor(state);
      }
      ImGuiStb::stb_textedit_clamp(this,state);
      ImGuiStb::stb_textedit_find_charpos
                (&find,this,(this->StbState).cursor,(uint)(this->StbState).single_line);
      if (find.prev_first == find.first_char) goto LAB_00140825;
      pSVar14 = (StbFindState *)&(this->StbState).preferred_x;
      if ((this->StbState).has_preferred_x == '\0') {
        pSVar14 = &find;
      }
      fVar1 = pSVar14->x;
      (this->StbState).cursor = find.prev_first;
      ImGuiStb::STB_TEXTEDIT_LAYOUTROW(&row,this,find.prev_first);
      iVar12 = 0;
      if (row.num_chars < 1) {
        row.num_chars = 0;
      }
      iVar25 = (this->StbState).cursor;
      fVar9 = row.x0;
      goto LAB_001404de;
    }
    key = key & 0x20000U | 0x10000;
    goto LAB_0013ff19;
  case 0x10003:
switchD_0013ff2c_caseD_10003:
    if (uVar2 != '\0') goto code_r0x0013ff6a;
    if ((key & 0x20000U) == 0) {
      if ((this->StbState).select_start != (this->StbState).select_end) {
        ImGuiStb::stb_textedit_move_to_last(this,state);
      }
    }
    else {
      ImGuiStb::stb_textedit_prep_selection_at_cursor(state);
    }
    ImGuiStb::stb_textedit_clamp(this,state);
    ImGuiStb::stb_textedit_find_charpos
              (&find,this,(this->StbState).cursor,(uint)(this->StbState).single_line);
    if (find.length == 0) goto LAB_00140825;
    pSVar14 = (StbFindState *)&(this->StbState).preferred_x;
    if ((this->StbState).has_preferred_x == '\0') {
      pSVar14 = &find;
    }
    fVar1 = pSVar14->x;
    iVar12 = find.length + find.first_char;
    (this->StbState).cursor = iVar12;
    ImGuiStb::STB_TEXTEDIT_LAYOUTROW(&row,this,iVar12);
    iVar25 = 0;
    if (row.num_chars < 1) {
      row.num_chars = 0;
    }
    iVar5 = (this->StbState).cursor;
    fVar9 = row.x0;
    goto LAB_0014040c;
  case 0x10004:
    ImGuiStb::stb_textedit_clamp(this,state);
    ImGuiStb::stb_textedit_move_to_first(state);
    if ((this->StbState).single_line == '\0') {
      iVar12 = (this->StbState).cursor;
      puVar8 = (this->TextW).Data;
      while ((0 < iVar12 && (puVar8[iVar12 - 1] != 10))) {
        iVar12 = iVar12 + -1;
        state->cursor = iVar12;
      }
    }
    else {
      state->cursor = 0;
    }
    goto LAB_00140821;
  case 0x10005:
    iVar12 = this->CurLenW;
    ImGuiStb::stb_textedit_clamp(this,state);
    ImGuiStb::stb_textedit_move_to_first(state);
    if ((this->StbState).single_line == '\0') {
      iVar25 = (this->StbState).cursor;
      puVar8 = (this->TextW).Data;
      for (lVar20 = (long)iVar25; (iVar25 = iVar25 + 1, lVar20 < iVar12 && (puVar8[lVar20] != 10));
          lVar20 = lVar20 + 1) {
        state->cursor = iVar25;
      }
    }
    else {
      state->cursor = iVar12;
    }
    goto LAB_00140821;
  case 0x10006:
    (this->StbState).select_end = 0;
    (this->StbState).cursor = 0;
    (this->StbState).select_start = 0;
    goto LAB_00140821;
  case 0x10007:
    (this->StbState).cursor = this->CurLenW;
    (this->StbState).select_start = 0;
    (this->StbState).select_end = 0;
    goto LAB_00140821;
  case 0x10008:
switchD_0013ff2c_caseD_10008:
    if ((this->StbState).select_start == (this->StbState).select_end) {
      iVar12 = (this->StbState).cursor;
      if (iVar12 < this->CurLenW) {
        ImGuiStb::stb_textedit_delete(this,state,iVar12,1);
      }
      goto LAB_00140821;
    }
    break;
  case 0x10009:
switchD_0013ff2c_caseD_10009:
    if ((this->StbState).select_start == (this->StbState).select_end) {
      ImGuiStb::stb_textedit_clamp(this,state);
      iVar12 = (this->StbState).cursor;
      if (0 < iVar12) {
        ImGuiStb::stb_textedit_delete(this,state,iVar12 + -1,1);
        (this->StbState).cursor = (this->StbState).cursor + -1;
      }
      goto LAB_00140821;
    }
    break;
  case 0x1000a:
    lVar20 = (long)(this->StbState).undostate.undo_point;
    if (lVar20 != 0) {
      iVar12 = (this->StbState).undostate.undo_rec[lVar20 + -1].where;
      iVar25 = (this->StbState).undostate.undo_rec[lVar20 + -1].insert_length;
      uVar18 = (this->StbState).undostate.undo_rec[lVar20 + -1].delete_length;
      iVar5 = (this->StbState).undostate.undo_rec[lVar20 + -1].char_storage;
      uVar16 = (ulong)(this->StbState).undostate.redo_point;
      (this->StbState).undostate.undo_rec[uVar16 - 1].char_storage = -1;
      (this->StbState).undostate.undo_rec[uVar16 - 1].insert_length = uVar18;
      (this->StbState).undostate.undo_rec[uVar16 - 1].delete_length = iVar25;
      (this->StbState).undostate.undo_rec[uVar16 - 1].where = iVar12;
      if ((long)(int)uVar18 != 0) {
        iVar26 = (this->StbState).undostate.undo_char_point;
        if ((int)(iVar26 + uVar18) < 999) {
          do {
            iVar23 = (this->StbState).undostate.redo_char_point;
            do {
              sVar17 = (short)uVar16;
              lVar20 = (long)sVar17;
              if ((int)(iVar26 + uVar18) <= iVar23) {
                (this->StbState).undostate.undo_rec[lVar20 + -1].char_storage = iVar23 - uVar18;
                uVar16 = 0;
                uVar22 = 0;
                if (0 < (int)uVar18) {
                  uVar22 = (ulong)uVar18;
                }
                (this->StbState).undostate.redo_char_point = iVar23 - uVar18;
                puVar8 = (this->TextW).Data;
                for (; uVar22 != uVar16; uVar16 = uVar16 + 1) {
                  *(unsigned_short *)
                   ((long)this + uVar16 * 2 + (long)iVar23 * 2 + (long)(int)uVar18 * -2 + 0x690) =
                       puVar8[(long)iVar12 + uVar16];
                }
                goto LAB_00140327;
              }
              if (sVar17 == 99) goto LAB_00140821;
            } while (0x62 < sVar17);
            if (-1 < (this->StbState).undostate.undo_rec[0x62].char_storage) {
              iVar26 = (this->StbState).undostate.undo_rec[0x62].insert_length;
              iVar23 = iVar23 + iVar26;
              (this->StbState).undostate.redo_char_point = iVar23;
              pIVar15 = (this->StbState).undostate.undo_char + iVar23;
              memmove(pIVar15,pIVar15 + -(long)iVar26,(long)(999 - iVar23) * 2);
              lVar20 = (long)(this->StbState).undostate.redo_point;
              piVar21 = &(this->StbState).undostate.undo_rec[lVar20].char_storage;
              for (lVar24 = lVar20; lVar24 < 0x62; lVar24 = lVar24 + 1) {
                if (-1 < *piVar21) {
                  *piVar21 = *piVar21 + iVar26;
                }
                piVar21 = piVar21 + 4;
              }
            }
            memmove((this->StbState).undostate.undo_rec + lVar20 + 1,
                    (this->StbState).undostate.undo_rec + lVar20,lVar20 * -0x10 + 0x630);
            iVar26 = (this->StbState).undostate.undo_char_point;
            uVar19 = *(int *)&(this->StbState).undostate.redo_point + 1;
            uVar16 = (ulong)uVar19;
            (this->StbState).undostate.redo_point = (short)uVar19;
          } while( true );
        }
        (this->StbState).undostate.undo_rec[uVar16 - 1].insert_length = 0;
LAB_00140327:
        ImGuiStb::STB_TEXTEDIT_DELETECHARS(this,iVar12,uVar18);
      }
      if (iVar25 != 0) {
        ImGuiStb::STB_TEXTEDIT_INSERTCHARS
                  (this,iVar12,(this->StbState).undostate.undo_char + iVar5,iVar25);
        piVar21 = &(this->StbState).undostate.undo_char_point;
        *piVar21 = *piVar21 - iVar25;
      }
      (this->StbState).cursor = iVar25 + iVar12;
      uVar4 = (this->StbState).undostate.undo_point;
      uVar7 = (this->StbState).undostate.redo_point;
      (this->StbState).undostate.undo_point = uVar4 + -1;
      (this->StbState).undostate.redo_point = uVar7 + -1;
    }
    goto LAB_00140821;
  case 0x1000b:
    lVar20 = (long)(this->StbState).undostate.redo_point;
    if (lVar20 != 99) {
      sVar17 = (this->StbState).undostate.undo_point;
      iVar12 = (this->StbState).undostate.undo_rec[lVar20].where;
      iVar25 = (this->StbState).undostate.undo_rec[lVar20].insert_length;
      uVar18 = (this->StbState).undostate.undo_rec[lVar20].delete_length;
      iVar5 = (this->StbState).undostate.undo_rec[lVar20].char_storage;
      (this->StbState).undostate.undo_rec[sVar17].delete_length = iVar25;
      (this->StbState).undostate.undo_rec[sVar17].insert_length = uVar18;
      (this->StbState).undostate.undo_rec[sVar17].where = iVar12;
      (this->StbState).undostate.undo_rec[sVar17].char_storage = -1;
      if (uVar18 != 0) {
        iVar26 = (this->StbState).undostate.undo_char_point;
        if ((this->StbState).undostate.redo_char_point < (int)(iVar26 + uVar18)) {
          pSVar10 = (this->StbState).undostate.undo_rec + sVar17;
          pSVar10->insert_length = 0;
          pSVar10->delete_length = 0;
        }
        else {
          (this->StbState).undostate.undo_rec[sVar17].char_storage = iVar26;
          (this->StbState).undostate.undo_char_point = iVar26 + uVar18;
          uVar16 = 0;
          uVar22 = 0;
          if (0 < (int)uVar18) {
            uVar22 = (ulong)uVar18;
          }
          puVar8 = (this->TextW).Data;
          for (; uVar22 != uVar16; uVar16 = uVar16 + 1) {
            (this->StbState).undostate.undo_char[(long)iVar26 + uVar16] =
                 puVar8[(long)iVar12 + uVar16];
          }
        }
        ImGuiStb::STB_TEXTEDIT_DELETECHARS(this,iVar12,uVar18);
      }
      if (iVar25 != 0) {
        ImGuiStb::STB_TEXTEDIT_INSERTCHARS
                  (this,iVar12,(this->StbState).undostate.undo_char + iVar5,iVar25);
        piVar21 = &(this->StbState).undostate.redo_char_point;
        *piVar21 = *piVar21 + iVar25;
      }
      (this->StbState).cursor = iVar25 + iVar12;
      uVar3 = (this->StbState).undostate.undo_point;
      uVar6 = (this->StbState).undostate.redo_point;
      (this->StbState).undostate.undo_point = uVar3 + 1;
      (this->StbState).undostate.redo_point = uVar6 + 1;
    }
    goto LAB_00140821;
  case 0x1000c:
    if ((this->StbState).select_start == (this->StbState).select_end) {
      iVar12 = ImGuiStb::STB_TEXTEDIT_MOVEWORDLEFT_IMPL(this,(this->StbState).cursor);
      goto LAB_00140184;
    }
    ImGuiStb::stb_textedit_move_to_first(state);
    goto LAB_00140825;
  case 0x1000d:
    if ((this->StbState).select_start == (this->StbState).select_end) {
      iVar12 = ImGuiStb::STB_TEXTEDIT_MOVEWORDRIGHT_IMPL(this,(this->StbState).cursor);
LAB_00140184:
      (this->StbState).cursor = iVar12;
LAB_00140187:
      ImGuiStb::stb_textedit_clamp(this,state);
    }
    else {
      ImGuiStb::stb_textedit_move_to_last(this,state);
    }
    goto LAB_00140825;
  default:
    switch(key) {
    case 0x30000:
      ImGuiStb::stb_textedit_clamp(this,state);
      ImGuiStb::stb_textedit_prep_selection_at_cursor(state);
      iVar12 = (this->StbState).select_end;
      if (0 < iVar12) {
        iVar12 = iVar12 + -1;
        goto LAB_001400b0;
      }
      break;
    case 0x30001:
      ImGuiStb::stb_textedit_prep_selection_at_cursor(state);
      piVar21 = &(this->StbState).select_end;
      *piVar21 = *piVar21 + 1;
      ImGuiStb::stb_textedit_clamp(this,state);
      iVar12 = (this->StbState).select_end;
      break;
    case 0x30002:
      goto switchD_0013ff2c_caseD_10002;
    case 0x30003:
      goto switchD_0013ff2c_caseD_10003;
    case 0x30004:
      ImGuiStb::stb_textedit_clamp(this,state);
      ImGuiStb::stb_textedit_prep_selection_at_cursor(state);
      if ((this->StbState).single_line == '\0') {
        uVar19 = (this->StbState).cursor;
        puVar8 = (this->TextW).Data;
        uVar13 = (int)uVar19 >> 0x1f & uVar19;
        while ((uVar18 = uVar13, 0 < (int)uVar19 && (uVar18 = uVar19, puVar8[uVar19 - 1] != 10))) {
          uVar19 = uVar19 - 1;
          state->cursor = uVar19;
        }
      }
      else {
        state->cursor = 0;
        uVar18 = 0;
      }
      (this->StbState).select_end = uVar18;
      goto LAB_00140821;
    case 0x30005:
      iVar12 = this->CurLenW;
      ImGuiStb::stb_textedit_clamp(this,state);
      ImGuiStb::stb_textedit_prep_selection_at_cursor(state);
      if ((this->StbState).single_line == '\0') {
        lVar24 = (long)iVar12;
        iVar25 = (this->StbState).cursor;
        lVar20 = (long)iVar25;
        puVar8 = (this->TextW).Data;
        if (lVar24 < lVar20) {
          iVar12 = iVar25;
        }
        goto LAB_0014067e;
      }
      state->cursor = iVar12;
      goto LAB_0014081d;
    case 0x30006:
      ImGuiStb::stb_textedit_prep_selection_at_cursor(state);
      (this->StbState).select_end = 0;
      (this->StbState).cursor = 0;
      goto LAB_00140821;
    case 0x30007:
      ImGuiStb::stb_textedit_prep_selection_at_cursor(state);
      iVar12 = this->CurLenW;
LAB_001400b0:
      (this->StbState).select_end = iVar12;
      break;
    case 0x30008:
      goto switchD_0013ff2c_caseD_10008;
    case 0x30009:
      goto switchD_0013ff2c_caseD_10009;
    default:
      uVar18 = 0;
      if (key < 0x10000) {
        uVar18 = key;
      }
      if (((int)uVar18 < 1) || (find.x._0_2_ = (undefined2)uVar18, uVar18 == 10 && uVar2 != '\0'))
      goto LAB_00140825;
      if (((this->StbState).insert_mode == '\0') ||
         ((this->StbState).select_start != (this->StbState).select_end)) {
LAB_001406ed:
        ImGuiStb::stb_textedit_delete_selection(this,state);
        bVar11 = ImGuiStb::STB_TEXTEDIT_INSERTCHARS(this,(this->StbState).cursor,(ImWchar *)&find,1)
        ;
        if (!bVar11) goto LAB_00140825;
        ImGuiStb::stb_text_makeundo_insert(state,state->cursor,1);
      }
      else {
        iVar12 = (this->StbState).cursor;
        if (this->CurLenW <= iVar12) goto LAB_001406ed;
        pIVar15 = ImGuiStb::stb_text_createundo(&(this->StbState).undostate,iVar12,1,1);
        if (pIVar15 != (ImWchar *)0x0) {
          *pIVar15 = (this->TextW).Data[iVar12];
        }
        ImGuiStb::STB_TEXTEDIT_DELETECHARS(this,(this->StbState).cursor,1);
        bVar11 = ImGuiStb::STB_TEXTEDIT_INSERTCHARS(this,(this->StbState).cursor,(ImWchar *)&find,1)
        ;
        if (!bVar11) goto LAB_00140825;
      }
      (this->StbState).cursor = (this->StbState).cursor + 1;
      goto LAB_00140821;
    case 0x3000c:
      if ((this->StbState).select_start == (this->StbState).select_end) {
        ImGuiStb::stb_textedit_prep_selection_at_cursor(state);
      }
      iVar12 = ImGuiStb::STB_TEXTEDIT_MOVEWORDLEFT_IMPL(this,(this->StbState).cursor);
      goto LAB_001400eb;
    case 0x3000d:
      if ((this->StbState).select_start == (this->StbState).select_end) {
        ImGuiStb::stb_textedit_prep_selection_at_cursor(state);
      }
      iVar12 = ImGuiStb::STB_TEXTEDIT_MOVEWORDRIGHT_IMPL(this,(this->StbState).cursor);
LAB_001400eb:
      (this->StbState).cursor = iVar12;
      (this->StbState).select_end = iVar12;
      goto LAB_00140187;
    }
    (this->StbState).cursor = iVar12;
    goto LAB_00140821;
  }
  ImGuiStb::stb_textedit_delete_selection(this,state);
  goto LAB_00140821;
LAB_0014067e:
  iVar25 = iVar25 + 1;
  if (lVar24 <= lVar20) goto LAB_0014081d;
  if (puVar8[lVar20] == 10) {
    iVar12 = (int)lVar20;
    goto LAB_0014081d;
  }
  lVar20 = lVar20 + 1;
  state->cursor = iVar25;
  goto LAB_0014067e;
LAB_0014081d:
  (this->StbState).select_end = iVar12;
  goto LAB_00140821;
code_r0x0013ff6a:
  key = key & 0x20000U | 0x10001;
  goto LAB_0013ff19;
LAB_0014040c:
  if (row.num_chars == iVar25) goto LAB_00140521;
  fVar27 = ImGuiStb::STB_TEXTEDIT_GETWIDTH(this,iVar12,iVar25);
  if (((fVar27 == -1.0) && (!NAN(fVar27))) || (fVar9 = fVar9 + fVar27, fVar1 < fVar9))
  goto LAB_00140521;
  state->cursor = iVar5 + 1 + iVar25;
  iVar25 = iVar25 + 1;
  goto LAB_0014040c;
LAB_001404de:
  if (row.num_chars == iVar12) goto LAB_00140521;
  fVar27 = ImGuiStb::STB_TEXTEDIT_GETWIDTH(this,find.prev_first,iVar12);
  if (((fVar27 == -1.0) && (!NAN(fVar27))) || (fVar9 = fVar9 + fVar27, fVar1 < fVar9))
  goto LAB_00140521;
  state->cursor = iVar25 + 1 + iVar12;
  iVar12 = iVar12 + 1;
  goto LAB_001404de;
LAB_00140521:
  ImGuiStb::stb_textedit_clamp(this,state);
  (this->StbState).has_preferred_x = '\x01';
  (this->StbState).preferred_x = fVar1;
  if ((key & 0x20000U) != 0) {
    (this->StbState).select_end = (this->StbState).cursor;
  }
  goto LAB_00140825;
switchD_0013ff2c_caseD_10000:
  if ((this->StbState).select_start == (this->StbState).select_end) {
    if (0 < state->cursor) {
      state->cursor = state->cursor + -1;
    }
  }
  else {
    ImGuiStb::stb_textedit_move_to_first(state);
  }
LAB_00140821:
  (this->StbState).has_preferred_x = '\0';
LAB_00140825:
  this->CursorFollow = true;
  this->CursorAnim = -0.3;
  return;
}

Assistant:

void ImGuiInputTextState::OnKeyPressed(int key)
{
    stb_textedit_key(this, &StbState, key);
    CursorFollow = true;
    CursorAnimReset();
}